

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_iwad.cpp
# Opt level: O2

int __thiscall FIWadManager::ScanIWAD(FIWadManager *this,char *iwad)

{
  char *__s1;
  int iVar1;
  char *in_RAX;
  FResourceFile *pFVar2;
  undefined4 extraout_var;
  size_t len;
  DWORD ii;
  uint uVar3;
  FString mapname;
  
  uVar3 = 0;
  mapname.Chars = in_RAX;
  pFVar2 = FResourceFile::OpenResourceFile(iwad,(FileReader *)0x0,true,false);
  if (pFVar2 != (FResourceFile *)0x0) {
    ClearChecks(this);
    for (; uVar3 < pFVar2->NumLumps; uVar3 = uVar3 + 1) {
      iVar1 = (*pFVar2->_vptr_FResourceFile[4])(pFVar2,(ulong)uVar3);
      CheckLumpName(this,(char *)(CONCAT44(extraout_var,iVar1) + 0x18));
      __s1 = *(char **)(CONCAT44(extraout_var,iVar1) + 0x10);
      if (*(int *)(__s1 + -0xc) != 0) {
        iVar1 = strncasecmp(__s1,"maps/",5);
        if (iVar1 == 0) {
          len = strcspn(__s1 + 5,".");
          FString::FString(&mapname,__s1 + 5,len);
          CheckLumpName(this,mapname.Chars);
          FString::~FString(&mapname);
        }
      }
    }
    (*pFVar2->_vptr_FResourceFile[1])(pFVar2);
  }
  iVar1 = GetIWadInfo(this);
  return iVar1;
}

Assistant:

int FIWadManager::ScanIWAD (const char *iwad)
{
	FResourceFile *iwadfile = FResourceFile::OpenResourceFile(iwad, NULL, true);

	if (iwadfile != NULL)
	{
		ClearChecks();
		for(DWORD ii = 0; ii < iwadfile->LumpCount(); ii++)
		{
			FResourceLump *lump = iwadfile->GetLump(ii);

			CheckLumpName(lump->Name);
			if (lump->FullName.IsNotEmpty())
			{
				if (strnicmp(lump->FullName, "maps/", 5) == 0)
				{
					FString mapname(&lump->FullName[5], strcspn(&lump->FullName[5], "."));
					CheckLumpName(mapname);
				}
			}
		}
		delete iwadfile;
	}
	return GetIWadInfo();
}